

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          CodedInputStream *input,FieldSkipper *field_skipper)

{
  FieldType FVar1;
  uint32 value;
  bool bVar2;
  int iVar3;
  LogMessage *other;
  ulong value_00;
  MessageLite *pMVar4;
  string *value_01;
  FieldDescriptor *pFVar5;
  uint64 uVar6;
  undefined7 in_register_00000011;
  uint32 temp;
  undefined4 uStack_74;
  LogFinisher local_39;
  Limit local_38;
  uint32 size;
  
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    bVar2 = io::CodedInputStream::ReadVarint32(input,&size);
    if (!bVar2) {
      return false;
    }
    local_38 = io::CodedInputStream::PushLimit(input,size);
    switch(extension->type) {
    case '\x01':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddDouble(this,number,'\x01',extension->is_packed,(double)CONCAT44(uStack_74,temp),
                  extension->descriptor);
      }
      break;
    case '\x02':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddFloat(this,number,'\x02',extension->is_packed,(float)temp,extension->descriptor);
      }
      break;
    case '\x03':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddInt64(this,number,'\x03',extension->is_packed,CONCAT44(uStack_74,temp),
                 extension->descriptor);
      }
      break;
    case '\x04':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddUInt64(this,number,'\x04',extension->is_packed,CONCAT44(uStack_74,temp),
                  extension->descriptor);
      }
      break;
    case '\x05':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddInt32(this,number,'\x05',extension->is_packed,temp,extension->descriptor);
      }
      break;
    case '\x06':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddUInt64(this,number,'\x06',extension->is_packed,CONCAT44(uStack_74,temp),
                  extension->descriptor);
      }
      break;
    case '\a':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddUInt32(this,number,'\a',extension->is_packed,temp,extension->descriptor);
      }
      break;
    case '\b':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddBool(this,number,'\b',extension->is_packed,CONCAT44(uStack_74,temp) != 0,
                extension->descriptor);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                ((LogMessage *)&temp,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x504);
      other = LogMessage::operator<<((LogMessage *)&temp,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_39,other);
      LogMessage::~LogMessage((LogMessage *)&temp);
      break;
    case '\r':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddUInt32(this,number,'\r',extension->is_packed,temp,extension->descriptor);
      }
      break;
    case '\x0e':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        value = temp;
        if (!bVar2) {
          return false;
        }
        bVar2 = (*(extension->field_3).enum_validity_check.func)
                          ((extension->field_3).enum_validity_check.arg,temp);
        if (bVar2) {
          AddEnum(this,number,'\x0e',extension->is_packed,value,extension->descriptor);
        }
        else {
          (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)value);
        }
      }
      break;
    case '\x0f':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddInt32(this,number,'\x0f',extension->is_packed,temp,extension->descriptor);
      }
      break;
    case '\x10':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddInt64(this,number,'\x10',extension->is_packed,CONCAT44(uStack_74,temp),
                 extension->descriptor);
      }
      break;
    case '\x11':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddInt32(this,number,'\x11',extension->is_packed,-(temp & 1) ^ temp >> 1,
                 extension->descriptor);
      }
      break;
    case '\x12':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddInt64(this,number,'\x12',extension->is_packed,
                 -(ulong)(temp & 1) ^ CONCAT44(uStack_74,temp) >> 1,extension->descriptor);
      }
    }
    io::CodedInputStream::PopLimit(input,local_38);
    return true;
  }
  switch(extension->type) {
  case '\x01':
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,(double)CONCAT44(uStack_74,temp),
                extension->descriptor);
      return true;
    }
    SetDouble(this,number,'\x01',(double)CONCAT44(uStack_74,temp),extension->descriptor);
    return true;
  case '\x02':
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,(float)temp,extension->descriptor);
    }
    else {
      SetFloat(this,number,'\x02',(float)temp,extension->descriptor);
    }
    break;
  case '\x03':
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    value_00 = CONCAT44(uStack_74,temp);
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\x03';
LAB_0029147f:
      SetInt64(this,number,FVar1,value_00,pFVar5);
      return true;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\x03';
    goto LAB_00290ec6;
  case '\x04':
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      uVar6 = CONCAT44(uStack_74,temp);
      pFVar5 = extension->descriptor;
      FVar1 = '\x04';
LAB_00291499:
      SetUInt64(this,number,FVar1,uVar6,pFVar5);
      return true;
    }
    bVar2 = extension->is_packed;
    uVar6 = CONCAT44(uStack_74,temp);
    pFVar5 = extension->descriptor;
    FVar1 = '\x04';
    goto LAB_00290f06;
  case '\x05':
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\x05';
LAB_002913fc:
      SetInt32(this,number,FVar1,temp,pFVar5);
      return true;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\x05';
    goto LAB_00290d05;
  case '\x06':
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      uVar6 = CONCAT44(uStack_74,temp);
      pFVar5 = extension->descriptor;
      FVar1 = '\x06';
      goto LAB_00291499;
    }
    bVar2 = extension->is_packed;
    uVar6 = CONCAT44(uStack_74,temp);
    pFVar5 = extension->descriptor;
    FVar1 = '\x06';
LAB_00290f06:
    AddUInt64(this,number,FVar1,bVar2,uVar6,pFVar5);
    break;
  case '\a':
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\a';
LAB_002914bf:
      SetUInt32(this,number,FVar1,temp,pFVar5);
      return true;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\a';
    goto LAB_00290f94;
  case '\b':
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,CONCAT44(uStack_74,temp) != 0,
              extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',CONCAT44(uStack_74,temp) != 0,extension->descriptor);
    }
    break;
  case '\t':
    pFVar5 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\t';
      goto LAB_00291381;
    }
    FVar1 = '\t';
LAB_00290fda:
    value_01 = AddString_abi_cxx11_(this,number,FVar1,pFVar5);
    goto LAB_0029138c;
  case '\n':
    pMVar4 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar4 = AddMessage(this,number,'\n',pMVar4,extension->descriptor);
    }
    else {
      pMVar4 = MutableMessage(this,number,'\n',pMVar4,extension->descriptor);
    }
    bVar2 = WireFormatLite::ReadGroup<google::protobuf::MessageLite>(number,input,pMVar4);
    goto LAB_00291397;
  case '\v':
    pMVar4 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar4 = AddMessage(this,number,'\v',pMVar4,extension->descriptor);
    }
    else {
      pMVar4 = MutableMessage(this,number,'\v',pMVar4,extension->descriptor);
    }
    bVar2 = WireFormatLite::ReadMessage<google::protobuf::MessageLite>(input,pMVar4);
    goto LAB_00291397;
  case '\f':
    pFVar5 = extension->descriptor;
    if (extension->is_repeated == true) {
      FVar1 = '\f';
      goto LAB_00290fda;
    }
    FVar1 = '\f';
LAB_00291381:
    value_01 = MutableString_abi_cxx11_(this,number,FVar1,pFVar5);
LAB_0029138c:
    bVar2 = WireFormatLite::ReadBytes(input,value_01);
LAB_00291397:
    if (bVar2 == false) {
      return false;
    }
    break;
  case '\r':
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\r';
      goto LAB_002914bf;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\r';
LAB_00290f94:
    AddUInt32(this,number,FVar1,bVar2,temp,pFVar5);
    break;
  case '\x0e':
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    bVar2 = (*(extension->field_3).enum_validity_check.func)
                      ((extension->field_3).enum_validity_check.arg,temp);
    if (bVar2) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,temp,extension->descriptor);
      }
      else {
        SetEnum(this,number,'\x0e',temp,extension->descriptor);
      }
    }
    else {
      (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)temp);
    }
    break;
  case '\x0f':
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\x0f';
      goto LAB_002913fc;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\x0f';
    goto LAB_00290d05;
  case '\x10':
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    value_00 = CONCAT44(uStack_74,temp);
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\x10';
      goto LAB_0029147f;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\x10';
    goto LAB_00290ec6;
  case '\x11':
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    temp = -(temp & 1) ^ temp >> 1;
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\x11';
      goto LAB_002913fc;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\x11';
LAB_00290d05:
    AddInt32(this,number,FVar1,bVar2,temp,pFVar5);
    break;
  case '\x12':
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    value_00 = -(ulong)(temp & 1) ^ CONCAT44(uStack_74,temp) >> 1;
    if (extension->is_repeated != true) {
      pFVar5 = extension->descriptor;
      FVar1 = '\x12';
      goto LAB_0029147f;
    }
    bVar2 = extension->is_packed;
    pFVar5 = extension->descriptor;
    FVar1 = '\x12';
LAB_00290ec6:
    AddInt64(this,number,FVar1,bVar2,value_00,pFVar5);
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(int number,
                                               bool was_packed_on_wire,
                                               const ExtensionInfo& extension,
                                               io::CodedInputStream* input,
                                               FieldSkipper* field_skipper) {
  // Explicitly not read extension.is_packed, instead check whether the field
  // was encoded in packed form on the wire.
  if (was_packed_on_wire) {
    uint32 size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    while (input->BytesUntilLimit() > 0) {                                  \
      CPP_LOWERCASE value;                                                  \
      if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                     \
                                         WireFormatLite::TYPE_##UPPERCASE>( \
              input, &value))                                               \
        return false;                                                       \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    }                                                                       \
    break

      HANDLE_TYPE(INT32, Int32, int32);
      HANDLE_TYPE(INT64, Int64, int64);
      HANDLE_TYPE(UINT32, UInt32, uint32);
      HANDLE_TYPE(UINT64, UInt64, uint64);
      HANDLE_TYPE(SINT32, Int32, int32);
      HANDLE_TYPE(SINT64, Int64, int64);
      HANDLE_TYPE(FIXED32, UInt32, uint32);
      HANDLE_TYPE(FIXED64, UInt64, uint64);
      HANDLE_TYPE(SFIXED32, Int32, int32);
      HANDLE_TYPE(SFIXED64, Int64, int64);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed,
                    value, extension.descriptor);
          } else {
            // Invalid value.  Treat as unknown.
            field_skipper->SkipUnknownEnum(number, value);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    CPP_LOWERCASE value;                                                    \
    if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                       \
                                       WireFormatLite::TYPE_##UPPERCASE>(   \
            input, &value))                                                 \
      return false;                                                         \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_TYPE(INT32, Int32, int32);
      HANDLE_TYPE(INT64, Int64, int64);
      HANDLE_TYPE(UINT32, UInt32, uint32);
      HANDLE_TYPE(UINT64, UInt64, uint64);
      HANDLE_TYPE(SINT32, Int32, int32);
      HANDLE_TYPE(SINT64, Int64, int64);
      HANDLE_TYPE(FIXED32, UInt32, uint32);
      HANDLE_TYPE(FIXED64, UInt64, uint64);
      HANDLE_TYPE(SFIXED32, Int32, int32);
      HANDLE_TYPE(SFIXED64, Int64, int64);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_BYTES,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_BYTES,
                                extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}